

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creadhb.c
# Opt level: O1

void creadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,singlecomplex **nzval,int_t **rowind,
            int_t **colptr)

{
  singlecomplex *z;
  long lVar1;
  singlecomplex *addr;
  int_t *__s;
  int_t *addr_00;
  long lVar2;
  ulong uVar3;
  int_t *piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int_t *addr_01;
  int iVar8;
  int_t *addr_02;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  double dVar13;
  int tmp;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf [100];
  char msg [256];
  int local_21c;
  singlecomplex **local_218;
  int_t **local_210;
  void *local_208;
  int_t *local_200;
  int_t *local_1f8;
  singlecomplex *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  undefined1 local_1cc;
  byte local_1cb;
  undefined1 local_1c9;
  int_t *local_1c8;
  ulong local_1c0;
  long local_1b8;
  int_t *local_1b0;
  char local_1a8 [14];
  undefined1 local_19a;
  char local_138 [264];
  
  local_218 = nzval;
  local_210 = rowind;
  fgets(local_1a8,100,(FILE *)fp);
  fputs(local_1a8,_stdout);
  iVar8 = 5;
  iVar9 = 0;
  iVar11 = 0;
  do {
    __isoc99_fscanf(fp,"%14c",local_1a8);
    local_19a = 0;
    __isoc99_sscanf(local_1a8,"%d",&local_21c);
    if (iVar8 == 2) {
      iVar11 = local_21c;
    }
    iVar10 = local_21c;
    if (local_21c == 0) {
      iVar10 = iVar9;
    }
    if (iVar8 != 1) {
      iVar10 = iVar9;
    }
    iVar9 = iVar10;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  do {
    iVar8 = fgetc((FILE *)fp);
  } while (iVar8 != 10);
  __isoc99_fscanf(fp,"%3c",&local_1cc);
  __isoc99_fscanf(fp,"%11c",local_1a8);
  local_1c9 = 0;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar8 = atoi(local_1a8);
  *nrow = iVar8;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar8 = atoi(local_1a8);
  *ncol = iVar8;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar8 = atoi(local_1a8);
  *nonz = iVar8;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  local_21c = atoi(local_1a8);
  if (local_21c != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar8 = fgetc((FILE *)fp);
  } while (iVar8 != 10);
  callocateA(*ncol,*nonz,local_218,local_210,colptr);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  cParseIntFormat(local_1a8,&local_1d0,&local_1d4);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  cParseIntFormat(local_1a8,&local_1d8,&local_1dc);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  cParseFloatFormat(local_1a8,&local_1e0,&local_1e4);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  do {
    iVar8 = fgetc((FILE *)fp);
  } while (iVar8 != 10);
  if (iVar9 != 0) {
    do {
      iVar8 = fgetc((FILE *)fp);
    } while (iVar8 != 10);
  }
  ReadVector(fp,*ncol + 1,*colptr,local_1d0,local_1d4);
  ReadVector(fp,*nonz,*local_210,local_1d8,local_1dc);
  if (iVar11 != 0) {
    cReadValues(fp,*nonz,*local_218,local_1e0,local_1e4);
  }
  if ((local_1cb & 0xdf) != 0x53) goto LAB_00109609;
  uVar12 = *ncol;
  uVar6 = (ulong)uVar12;
  piVar4 = *local_210;
  addr_02 = *colptr;
  addr = *local_218;
  iVar11 = uVar12 + 1;
  __s = intMalloc(iVar11);
  if (__s == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xd5,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
    superlu_abort_and_exit(local_138);
  }
  local_200 = intMalloc(iVar11);
  if (local_200 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xd7,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
    superlu_abort_and_exit(local_138);
  }
  addr_00 = intMalloc(*nonz);
  if (addr_00 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xd9,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
    superlu_abort_and_exit(local_138);
  }
  local_208 = superlu_malloc((long)*nonz << 3);
  if (local_208 == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xdb,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
    superlu_abort_and_exit(local_138);
  }
  if ((int)uVar12 < 1) {
    *local_200 = 0;
LAB_001092f1:
    if (0 < (int)uVar12) {
      uVar3 = 0;
      do {
        lVar2 = (long)addr_02[uVar3];
        uVar5 = uVar3 + 1;
        if (addr_02[uVar3] < addr_02[uVar3 + 1]) {
          do {
            iVar8 = piVar4[lVar2];
            addr_00[__s[iVar8]] = (int_t)uVar3;
            *(singlecomplex *)((long)local_208 + (long)__s[iVar8] * 8) = addr[lVar2];
            __s[iVar8] = __s[iVar8] + 1;
            lVar2 = lVar2 + 1;
          } while (lVar2 < addr_02[uVar5]);
        }
        uVar3 = uVar5;
      } while (uVar5 != uVar6);
    }
  }
  else {
    memset(__s,0,uVar6 * 4);
    uVar3 = 0;
    do {
      lVar2 = (long)addr_02[uVar3];
      uVar5 = uVar3 + 1;
      if (addr_02[uVar3] < addr_02[uVar3 + 1]) {
        do {
          __s[piVar4[lVar2]] = __s[piVar4[lVar2]] + 1;
          lVar2 = lVar2 + 1;
        } while (lVar2 < addr_02[uVar5]);
      }
      uVar3 = uVar5;
    } while (uVar5 != uVar6);
    *local_200 = 0;
    if (0 < (int)uVar12) {
      uVar3 = 0;
      do {
        local_200[uVar3 + 1] = __s[uVar3] + local_200[uVar3];
        __s[uVar3] = local_200[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
      goto LAB_001092f1;
    }
  }
  lVar2 = (long)*nonz * 2 - (long)(int)uVar12;
  local_1f8 = intMalloc(iVar11);
  if (local_1f8 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xf4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
    superlu_abort_and_exit(local_138);
  }
  local_1c8 = piVar4;
  piVar4 = intMalloc((int_t)lVar2);
  if (piVar4 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xf6,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
    superlu_abort_and_exit(local_138);
  }
  local_1b8 = lVar2;
  local_1f0 = (singlecomplex *)superlu_malloc(lVar2 * 8);
  if (local_1f0 == (singlecomplex *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xf8,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
    superlu_abort_and_exit(local_138);
  }
  *local_1f8 = 0;
  addr_01 = local_200;
  if (0 < (int)uVar12) {
    uVar12 = 0;
    uVar3 = 0;
    local_1c0 = uVar6;
    local_1b0 = addr_02;
    do {
      lVar2 = (long)addr_01[uVar3];
      uVar6 = uVar3 + 1;
      if (addr_01[uVar3] < addr_01[uVar3 + 1]) {
        do {
          if (uVar3 != (uint)addr_00[lVar2]) {
            piVar4[(int)uVar12] = addr_00[lVar2];
            z = local_1f0 + (int)uVar12;
            local_1f0[(int)uVar12] = *(singlecomplex *)((long)local_208 + lVar2 * 8);
            dVar13 = c_abs1(z);
            if (dVar13 < 4.047e-300) {
              printf("%5d: %e\t%e\n",(double)z->r,(double)z->i,(ulong)uVar12);
            }
            uVar12 = uVar12 + 1;
            addr_01 = local_200;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < addr_01[uVar6]);
      }
      lVar2 = (long)local_1b0[uVar3];
      if (local_1b0[uVar3] < local_1b0[uVar6]) {
        lVar7 = 0;
        do {
          piVar4[(int)uVar12 + lVar7] = local_1c8[lVar2 + lVar7];
          local_1f0[(int)uVar12 + lVar7] = addr[lVar2 + lVar7];
          lVar1 = lVar2 + lVar7;
          lVar7 = lVar7 + 1;
        } while (lVar1 + 1 < (long)local_1b0[uVar6]);
        uVar12 = uVar12 + (int)lVar7;
      }
      local_1f8[uVar6] = uVar12;
      addr_02 = local_1b0;
      uVar3 = uVar6;
    } while (uVar6 != local_1c0);
  }
  lVar2 = local_1b8;
  printf("FormFullA: new_nnz = %lld\n",local_1b8);
  superlu_free(addr);
  superlu_free(local_1c8);
  superlu_free(addr_02);
  superlu_free(__s);
  superlu_free(local_208);
  superlu_free(addr_00);
  superlu_free(addr_01);
  *local_218 = local_1f0;
  *local_210 = piVar4;
  *colptr = local_1f8;
  *nonz = (int_t)lVar2;
LAB_00109609:
  fclose((FILE *)fp);
  return;
}

Assistant:

void
creadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	singlecomplex **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    cDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    cDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    callocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    cParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    cParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    cParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    cDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) cDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        cReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}